

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemapping.cpp
# Opt level: O0

bool __thiscall
myutils::FileMapping::create_file(FileMapping *this,string *filename,uint32_t filesize)

{
  int __fd;
  ulong uVar1;
  char *pcVar2;
  void *__buf;
  char *p_1;
  char *p;
  char *buf;
  int fd;
  uint32_t filesize_local;
  string *filename_local;
  FileMapping *this_local;
  
  std::__cxx11::string::operator=((string *)&this->m_id,(string *)filename);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    __fd = open(pcVar2,0x42,0x1c0);
    if (__fd == -1) {
      this_local._7_1_ = false;
    }
    else {
      fchmod(__fd,0x180);
      __buf = operator_new__((ulong)filesize);
      write(__fd,__buf,(ulong)filesize);
      if (__buf != (void *)0x0) {
        operator_delete__(__buf);
      }
      pcVar2 = (char *)mmap((void *)0x0,(ulong)filesize,3,1,__fd,0);
      if (pcVar2 == (char *)0xffffffffffffffff) {
        ::close(__fd);
        this_local._7_1_ = false;
      }
      else {
        this->m_pMapAddress = pcVar2;
        this->m_fd = __fd;
        this->m_filesize = filesize;
        this_local._7_1_ = true;
      }
    }
  }
  else {
    pcVar2 = (char *)mmap((void *)0x0,(ulong)filesize,3,0x21,0,0);
    if (pcVar2 == (char *)0xffffffffffffffff) {
      this_local._7_1_ = false;
    }
    else {
      this->m_pMapAddress = pcVar2;
      this->m_fd = -1;
      this->m_filesize = filesize;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool FileMapping::create_file(const string& filename, uint32_t filesize)
{
    m_id = filename;    

    if (!filename.empty()) {
        int fd = ::open(filename.c_str(), O_CREAT | O_RDWR, S_IRWXU);
        if ( fd == -1) {
            //VLOG(1) <<"Can't create " << filename <<", error=" << strerror(errno);
            return false;
        }

        fchmod(fd, S_IRUSR | S_IWUSR);
        
        char* buf = new char[filesize];
        write(fd, buf, filesize);
        delete[] buf;
        
        char* p = (char*)mmap(nullptr, filesize, PROT_READ|PROT_WRITE, MAP_SHARED, fd, 0);
        if (p != MAP_FAILED) {
            m_pMapAddress = p;
            m_fd = fd;
            m_filesize = filesize;

            return true;
        } else {
            ::close(fd);
            return false;
        }
    }
    else {
        char* p = (char*)mmap(nullptr, filesize, PROT_READ|PROT_WRITE, MAP_SHARED | MAP_ANON, 0, 0);        
        if (p != MAP_FAILED) {
            m_pMapAddress = p;
            m_fd = -1;
            m_filesize = filesize;

            return true;
        } else {
            return false;
        }
    }

}